

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O2

void __thiscall
icu_63::numparse::impl::StringSegment::StringSegment
          (StringSegment *this,UnicodeString *str,bool ignoreCase)

{
  short sVar1;
  int iVar2;
  
  UnicodeString::UnicodeString(&this->fStr,str);
  this->fStart = 0;
  sVar1 = (str->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar2 = (str->fUnion).fFields.fLength;
  }
  else {
    iVar2 = (int)sVar1 >> 5;
  }
  this->fEnd = iVar2;
  this->fFoldCase = ignoreCase;
  return;
}

Assistant:

StringSegment::StringSegment(const UnicodeString& str, bool ignoreCase)
        : fStr(str), fStart(0), fEnd(str.length()),
          fFoldCase(ignoreCase) {}